

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseNode(Parser *this)

{
  CodeLocation *args;
  bool bVar1;
  uint32_t uVar2;
  Module *pMVar3;
  ProcessorInstance *pPVar4;
  CodeLocation errorPos;
  string name;
  CodeLocation local_90;
  ProcessorInstance *local_80 [8];
  string local_40;
  
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_40,this);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  args = &(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).location;
  pPVar4 = Module::allocate<soul::heart::ProcessorInstance,soul::CodeLocation&>(pMVar3,args);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_80[0] = pPVar4;
  std::
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
  ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
            ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
              *)&pMVar3->processorInstances,(pool_ref<soul::heart::ProcessorInstance> *)local_80);
  std::__cxx11::string::_M_assign((string *)&pPVar4->instanceName);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2a3521);
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)local_80,this);
  std::__cxx11::string::operator=((string *)&pPVar4->sourceName,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2cada8);
  if (bVar1) {
    uVar2 = parseProcessorArraySize(this);
    pPVar4->arraySize = uVar2;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a0190);
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2c9772);
  if (bVar1) {
    local_90.sourceCode.object = (args->sourceCode).object;
    if (local_90.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_90.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_90.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_90.location.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    parseInt32Value((Value *)local_80,this);
    ClockMultiplier::setMultiplier<soul::CodeLocation&>
              (&pPVar4->clockMultiplier,&local_90,(Value *)local_80);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2a2995);
    if (!bVar1) goto LAB_0027364f;
    local_90.sourceCode.object = (args->sourceCode).object;
    if (local_90.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_90.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_90.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_90.location.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    parseInt32Value((Value *)local_80,this);
    ClockMultiplier::setDivider<soul::CodeLocation&>
              (&pPVar4->clockMultiplier,&local_90,(Value *)local_80);
  }
  soul::Value::~Value((Value *)local_80);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_90.sourceCode);
LAB_0027364f:
  expectSemicolon(this);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void parseNode()
    {
        auto name = readQualifiedGeneralIdentifier();

        auto& mi = module->allocate<heart::ProcessorInstance> (location);
        module->processorInstances.push_back (mi);
        mi.instanceName = name;
        expect (HEARTOperator::assign);
        mi.sourceName = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            mi.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        if (matchIf (HEARTOperator::times))
        {
            auto errorPos = location;
            mi.clockMultiplier.setMultiplier (errorPos, parseInt32Value());
        }
        else if (matchIf (HEARTOperator::divide))
        {
            auto errorPos = location;
            mi.clockMultiplier.setDivider (errorPos, parseInt32Value());
        }

        expectSemicolon();
    }